

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureCompletenessTests::init
          (TextureCompletenessTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  Context *pCVar2;
  TestContext *pTVar3;
  ContextInfo *pCVar4;
  int extraout_EAX;
  TestNode *pTVar5;
  TestNode *node;
  TestNode *pTVar6;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D completeness");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cubemap completeness");
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"npot_size",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120540;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0xff000000;
  pTVar6[1].m_name._M_string_length = 0xff000000ff;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0xff000000ff;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"npot_size_level_0",glcts::fixed_sample_locations_values + 1)
  ;
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120540;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0xff000000;
  pTVar6[1].m_name._M_string_length = 0xff000000ff;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x10000000100;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"npot_size_level_1",glcts::fixed_sample_locations_values + 1)
  ;
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120540;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar6[1].m_name._M_string_length = 0x7f0000007f;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x10000000100;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"not_positive_level_0",
             glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120540;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0xff000000;
  pTVar6[1].m_name._M_string_length = 0;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x10000000100;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"format_mismatch_rgb_rgba",
             glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120590;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar6[1].m_name._M_string_length = 0x190800001907;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 0x8000000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"format_mismatch_rgba_rgb",
             glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120590;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar6[1].m_name._M_string_length = 0x190700001908;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 0x8000000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"format_mismatch_luminance_luminance_alpha",
             glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120590;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar6[1].m_name._M_string_length = 0x190a00001909;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 0x8000000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"format_mismatch_luminance_alpha_luminance",
             glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120590;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar6[1].m_name._M_string_length = 0x19090000190a;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 0x8000000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"missing_level_1",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021205d0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar6[1].m_name._M_string_length = 0x8000000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"missing_level_3",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021205d0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x3ff000000;
  pTVar6[1].m_name._M_string_length = 0x8000000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"last_level_missing",glcts::fixed_sample_locations_values + 1
            );
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021205d0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x7ff000000;
  pTVar6[1].m_name._M_string_length = 0x4000000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"npot_t_repeat",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120610;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x29010000812f;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"npot_s_repeat",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120610;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x812f00002901;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"npot_all_repeat",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120610;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"npot_mirrored_repeat",
             glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120610;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x837000008370;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"repeat_width_npot",glcts::fixed_sample_locations_values + 1)
  ;
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120610;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x800000007f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"repeat_height_npot",glcts::fixed_sample_locations_values + 1
            );
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120610;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar6[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0x7f00000080;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"extra_level",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120650;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pTVar1,"empty_object",glcts::fixed_sample_locations_values + 1);
  pTVar6[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar6[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120690;
  *(undefined8 *)((long)&pTVar6[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_size_level_0",glcts::fixed_sample_locations_values + 1)
  ;
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021206d0;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xff000000;
  pTVar5[1].m_name._M_string_length = 0x3f0000003f;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000006;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_size_level_1",glcts::fixed_sample_locations_values + 1)
  ;
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021206d0;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar5[1].m_name._M_string_length = 0x1f0000001f;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000006;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_size_level_0_pos_x",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021206d0;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xff000000;
  pTVar5[1].m_name._M_string_length = 0x3f0000003f;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000001;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_size_level_1_neg_x",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021206d0;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar5[1].m_name._M_string_length = 0x1f0000001f;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000000;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"not_positive_level_0",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021206d0;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0xff000000;
  pTVar5[1].m_name._M_string_length = 0;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000006;
  *(undefined4 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"format_mismatch_rgb_rgba_level_0",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120710;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1907ff000000;
  pTVar5[1].m_name._M_string_length = 0x600001908;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"format_mismatch_rgba_rgb_level_0",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120710;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1908ff000000;
  pTVar5[1].m_name._M_string_length = 0x600001907;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"format_mismatch_luminance_luminance_alpha_level_0",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120710;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1909ff000000;
  pTVar5[1].m_name._M_string_length = 0x60000190a;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"format_mismatch_luminance_alpha_luminance_level_0",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120710;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x190aff000000;
  pTVar5[1].m_name._M_string_length = 0x600001909;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"format_mismatch_rgb_rgba_level_0_pos_z",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120710;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1907ff000000;
  pTVar5[1].m_name._M_string_length = 0x500001908;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"format_mismatch_rgba_rgb_level_0_neg_z",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120710;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1908ff000000;
  pTVar5[1].m_name._M_string_length = 0x400001907;
  pTVar5[1].m_name.field_2._M_allocated_capacity = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"missing_level_1",glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120750;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar5[1].m_name._M_string_length = 0x4000000006;
  *(undefined4 *)&pTVar5[1].m_name.field_2 = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"missing_level_3",glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120750;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x3ff000000;
  pTVar5[1].m_name._M_string_length = 0x4000000006;
  *(undefined4 *)&pTVar5[1].m_name.field_2 = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"missing_level_1_pos_y",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120750;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x1ff000000;
  pTVar5[1].m_name._M_string_length = 0x4000000003;
  *(undefined4 *)&pTVar5[1].m_name.field_2 = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x98);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"missing_level_3_neg_y",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120750;
  pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x3ff000000;
  pTVar5[1].m_name._M_string_length = 0x4000000002;
  *(undefined4 *)&pTVar5[1].m_name.field_2 = 0x40;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_t_repeat",glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120790;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x29010000812f;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_s_repeat",glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120790;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x812f00002901;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_all_repeat",glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120790;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x290100002901;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0xa0);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar2 = (this->super_TestCaseGroup).m_context;
  pTVar3 = (TestContext *)pCVar2->m_renderCtx;
  pCVar4 = pCVar2->m_contextInfo;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"npot_mirrored_repeat",
             glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120790;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x837000008370;
  pTVar5[1].m_name.field_2._M_allocated_capacity = (size_type)pCVar4;
  *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0x7f0000007f;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"extra_level",glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021207d0;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  pTVar5 = (TestNode *)operator_new(0x90);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar3 = (TestContext *)((this->super_TestCaseGroup).m_context)->m_renderCtx;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar5,pTVar1,"empty_object",glcts::fixed_sample_locations_values + 1);
  pTVar5[1]._vptr_TestNode = (_func_int **)pTVar1;
  pTVar5[1].m_testCtx = pTVar3;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0xff000000;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_02120810;
  *(undefined8 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 0x4000000040;
  tcu::TestNode::addChild(node,pTVar5);
  return extraout_EAX;
}

Assistant:

void TextureCompletenessTests::init (void)
{
	tcu::TestCaseGroup* tex2d = new tcu::TestCaseGroup(m_testCtx, "2d", "2D completeness");
	addChild(tex2d);
	tcu::TestCaseGroup* cube = new tcu::TestCaseGroup(m_testCtx, "cube", "Cubemap completeness");
	addChild(cube);

	// Texture 2D size.
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size",				"", IVec2(255, 255), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",		"", IVec2(256, 256), IVec2(255, 255), 0, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",		"", IVec2(256, 256), IVec2(127, 127), 1, m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",	"", IVec2(256, 256), IVec2(0, 0),	  0, m_context.getContextInfo()));
	// Texture 2D format.
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba",						"", IVec2(128, 128), GL_RGB,				GL_RGBA,			1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb",						"", IVec2(128, 128), GL_RGBA,				GL_RGB,				1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha",	"", IVec2(128, 128), GL_LUMINANCE,			GL_LUMINANCE_ALPHA,	1));
	tex2d->addChild(new Incomplete2DFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance",	"", IVec2(128, 128), GL_LUMINANCE_ALPHA,	GL_LUMINANCE,		1));
	// Texture 2D missing level.
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",			"", IVec2(128, 128),	1));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",			"", IVec2(128, 128),	3));
	tex2d->addChild(new Incomplete2DMissingLevelCase(m_testCtx, m_context.getRenderContext(), "last_level_missing",			"", IVec2(128, 64),		de::max(deLog2Floor32(128), deLog2Floor32(64))));
	// Texture 2D wrap modes.
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_width_npot",		"", IVec2(127, 128), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	tex2d->addChild(new Incomplete2DWrapModeCase(m_testCtx, m_context.getRenderContext(), "repeat_height_npot",		"", IVec2(128, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	// Texture 2D extra level.
	tex2d->addChild(new Complete2DExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Texture 2D empty object.
	tex2d->addChild(new Incomplete2DEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));

	// Cube size.
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0",			"", IVec2(64, 64), IVec2(63, 63), 0));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1",			"", IVec2(64, 64), IVec2(31, 31), 1));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_0_pos_x",	"", IVec2(64, 64), IVec2(63, 63), 0, tcu::CUBEFACE_POSITIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "npot_size_level_1_neg_x",	"", IVec2(64, 64), IVec2(31, 31), 1, tcu::CUBEFACE_NEGATIVE_X));
	cube->addChild(new IncompleteCubeSizeCase(m_testCtx, m_context.getRenderContext(), "not_positive_level_0",		"", IVec2(64, 64), IVec2(0,0)	, 0));
	// Cube format.
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0",					"", IVec2(64, 64), GL_RGB,				GL_RGBA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0",					"", IVec2(64, 64), GL_RGBA,				GL_RGB));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_luminance_alpha_level_0",	"", IVec2(64, 64), GL_LUMINANCE,		GL_LUMINANCE_ALPHA));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_luminance_alpha_luminance_level_0",	"", IVec2(64, 64), GL_LUMINANCE_ALPHA,	GL_LUMINANCE));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgb_rgba_level_0_pos_z",				"", IVec2(64, 64), GL_RGB,				GL_RGBA,	tcu::CUBEFACE_POSITIVE_Z));
	cube->addChild(new IncompleteCubeFormatCase(m_testCtx, m_context.getRenderContext(), "format_mismatch_rgba_rgb_level_0_neg_z",				"", IVec2(64, 64), GL_RGBA,				GL_RGB,		tcu::CUBEFACE_NEGATIVE_Z));
	// Cube missing level.
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1",		"", IVec2(64, 64), 1));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3",		"", IVec2(64, 64), 3));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_1_pos_y",	"", IVec2(64, 64), 1, tcu::CUBEFACE_POSITIVE_Y));
	cube->addChild(new IncompleteCubeMissingLevelCase(m_testCtx, m_context.getRenderContext(), "missing_level_3_neg_y",	"", IVec2(64, 64), 3, tcu::CUBEFACE_NEGATIVE_Y));
	// Cube wrap modes.
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_t_repeat",			"", IVec2(127, 127), GL_CLAMP_TO_EDGE,		GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_s_repeat",			"", IVec2(127, 127), GL_REPEAT,				GL_CLAMP_TO_EDGE,		m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_all_repeat",		"", IVec2(127, 127), GL_REPEAT,				GL_REPEAT,				m_context.getContextInfo()));
	cube->addChild(new IncompleteCubeWrapModeCase(m_testCtx, m_context.getRenderContext(), "npot_mirrored_repeat",	"", IVec2(127, 127), GL_MIRRORED_REPEAT,	GL_MIRRORED_REPEAT,		m_context.getContextInfo()));
	// Cube extra level.
	cube->addChild(new CompleteCubeExtraLevelCase(m_testCtx, m_context.getRenderContext(), "extra_level", "", IVec2(64, 64)));
	// Cube extra level.
	cube->addChild(new IncompleteCubeEmptyObjectCase(m_testCtx, m_context.getRenderContext(), "empty_object", "", IVec2(64, 64)));
}